

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapeReshapeLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  LogMessage *pLVar1;
  mapped_type *this_00;
  mapped_type *this_01;
  LayerUnion from;
  ShapeRange *pSVar2;
  ShapeRange *other;
  long lVar3;
  ReshapeLayerParams reshape;
  LogFinisher local_1e1;
  LogMessage local_1e0;
  ReshapeLayerParams local_1a8;
  LogMessage local_178;
  LogMessage local_140;
  LogMessage local_108;
  LogMessage local_d0;
  LogMessage local_98;
  LogMessage local_60;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_d0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_d0);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_98,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_98);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar1 = google::protobuf::internal::LogMessage::operator<<
                       (&local_60,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar1);
    google::protobuf::internal::LogMessage::~LogMessage(&local_60);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if (specLayer->_oneof_case_[0] == 300) {
    from = specLayer->layer_;
  }
  else {
    from.reshape_ = Specification::ReshapeLayerParams::default_instance();
  }
  Specification::ReshapeLayerParams::ReshapeLayerParams(&local_1a8,from.reshape_);
  pSVar2 = ShapeConstraint::batchRange(this_00);
  ShapeConstraint::updateBatchRange(this_01,pSVar2);
  if (local_1a8.targetshape_.current_size_ == 3) {
    pSVar2 = ShapeConstraint::sequenceRange(this_01);
    other = ShapeConstraint::sequenceRange(this_00);
    ShapeRange::intersect((ShapeRange *)&local_1e0,pSVar2,other);
    ShapeConstraint::updateSequenceRange(this_01,(ShapeRange *)&local_1e0);
    if (local_1a8.targetshape_.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_140,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_140,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_140);
    }
    ShapeConstraint::setChannel(this_01,(local_1a8.targetshape_.rep_)->elements[0]);
    if (local_1a8.targetshape_.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_178,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_178,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_178);
    }
    ShapeConstraint::setHeight(this_01,(size_t)local_1a8.targetshape_.rep_[1].arena);
    if (local_1a8.targetshape_.current_size_ < 3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_1e0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_1e0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_108,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_1e0);
    }
    lVar3 = 0x18;
  }
  else {
    if (local_1a8.targetshape_.current_size_ < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_108,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_108,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_178,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_108);
    }
    ShapeRange::ShapeRange((ShapeRange *)&local_1e0,(local_1a8.targetshape_.rep_)->elements[0]);
    ShapeConstraint::updateSequenceRange(this_01,(ShapeRange *)&local_1e0);
    if (local_1a8.targetshape_.current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_140,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_140,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_140);
    }
    ShapeConstraint::setChannel(this_01,(size_t)local_1a8.targetshape_.rep_[1].arena);
    if (local_1a8.targetshape_.current_size_ < 3) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_178,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_178,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_1e0,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_178);
    }
    ShapeConstraint::setHeight(this_01,local_1a8.targetshape_.rep_[1].elements[0]);
    if (local_1a8.targetshape_.current_size_ < 4) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_1e0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar1 = google::protobuf::internal::LogMessage::operator<<
                         (&local_1e0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=(&local_1e1,pLVar1);
      google::protobuf::internal::LogMessage::~LogMessage(&local_1e0);
    }
    lVar3 = 0x20;
  }
  ShapeConstraint::setWidth
            (this_01,*(size_t *)((long)(local_1a8.targetshape_.rep_)->elements + lVar3 + -8));
  Specification::ReshapeLayerParams::~ReshapeLayerParams(&local_1a8);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeReshapeLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reshape layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reshape layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    // TODO: there is some cross shape constraint here -- all 3 or 4 input ranges might be unconstrained, but now they are constrained to a combination whose product is
    // equal to the product of the output shapes

    Specification::ReshapeLayerParams reshape = specLayer.reshape();

    outputShape.updateBatchRange(inputShape.batchRange());

    if (reshape.targetshape_size() == 3) {
        outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
        outputShape.setChannel(static_cast<size_t>(reshape.targetshape(0)));
        outputShape.setHeight(static_cast<size_t>(reshape.targetshape(1)));
        outputShape.setWidth(static_cast<size_t>(reshape.targetshape(2)));
    } else {
        outputShape.updateSequenceRange(static_cast<size_t>(reshape.targetshape(0)));
        outputShape.setChannel(static_cast<size_t>(reshape.targetshape(1)));
        outputShape.setHeight(static_cast<size_t>(reshape.targetshape(2)));
        outputShape.setWidth(static_cast<size_t>(reshape.targetshape(3)));
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Reshape layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Reshape layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}